

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_uint32 ma_rb_available_write(ma_rb *pRB)

{
  ma_int32 mVar1;
  size_t sVar2;
  ma_rb *in_RDI;
  undefined4 local_4;
  
  if (in_RDI == (ma_rb *)0x0) {
    local_4 = 0;
  }
  else {
    sVar2 = ma_rb_get_subbuffer_size(in_RDI);
    mVar1 = ma_rb_pointer_distance(in_RDI);
    local_4 = (int)sVar2 - mVar1;
  }
  return local_4;
}

Assistant:

MA_API ma_uint32 ma_rb_available_write(ma_rb* pRB)
{
    if (pRB == NULL) {
        return 0;
    }

    return (ma_uint32)(ma_rb_get_subbuffer_size(pRB) - ma_rb_pointer_distance(pRB));
}